

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

bool __thiscall
cmake::SetCacheArgs(cmake *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args)

{
  code *pcVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long *plVar6;
  pointer pbVar7;
  anon_class_1_0_00000001 *func;
  Values t;
  string *input;
  long lVar8;
  cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
  *m;
  pointer this_00;
  int iVar9;
  long lVar10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  initializer_list<cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>_>
  __l;
  vector<cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>,_std::allocator<cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>_>_>
  arguments;
  undefined1 *local_688;
  size_type local_680;
  undefined1 local_678;
  undefined7 uStack_677;
  undefined8 uStack_670;
  undefined1 *local_668;
  size_type local_660;
  undefined1 local_658;
  undefined7 uStack_657;
  undefined8 uStack_650;
  undefined1 *local_648;
  size_type local_640;
  undefined1 local_638;
  undefined7 uStack_637;
  undefined8 uStack_630;
  undefined1 *local_628;
  size_type local_620;
  undefined1 local_618;
  undefined7 uStack_617;
  undefined8 uStack_610;
  undefined1 *local_608;
  size_type local_600;
  undefined1 local_5f8;
  undefined7 uStack_5f7;
  undefined8 uStack_5f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5e8;
  size_type local_5e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d8;
  anon_class_1_0_00000001 *local_5c8;
  size_type local_5c0;
  anon_class_1_0_00000001 local_5b8;
  undefined7 uStack_5b7;
  undefined8 uStack_5b0;
  undefined1 *local_5a8;
  undefined8 local_5a0;
  undefined1 local_598;
  undefined7 uStack_597;
  undefined8 uStack_590;
  undefined1 *local_588;
  undefined8 local_580;
  undefined1 local_578;
  undefined7 uStack_577;
  undefined8 uStack_570;
  undefined1 *local_568;
  undefined8 local_560;
  undefined1 local_558;
  undefined7 uStack_557;
  undefined8 uStack_550;
  undefined1 *local_548;
  undefined8 local_540;
  undefined1 local_538;
  undefined7 uStack_537;
  undefined8 uStack_530;
  undefined1 *local_528;
  undefined8 local_520;
  undefined1 local_518;
  undefined7 uStack_517;
  undefined8 uStack_510;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_508;
  size_type local_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  cmake **local_4e8 [2];
  cmake *local_4d8 [2];
  basic_string_view<char,_std::char_traits<char>_> local_4c8;
  size_type local_4b8;
  anon_class_1_0_00000001 *local_4b0;
  string local_4a8;
  vector<cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>,_std::allocator<cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>_>_>
  local_488;
  cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
  local_470;
  string local_3e8;
  undefined1 *local_3c8;
  undefined8 local_3c0;
  undefined1 local_3b8 [8];
  undefined8 uStack_3b0;
  undefined1 *local_3a8;
  size_type local_3a0;
  undefined1 local_398 [8];
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 local_380;
  undefined8 uStack_378;
  code *local_370;
  code *local_368;
  string local_360;
  undefined1 *local_340;
  undefined8 local_338;
  undefined1 local_330 [8];
  undefined8 uStack_328;
  undefined1 *local_320;
  size_type local_318;
  undefined1 local_310 [8];
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  code *local_2e8;
  code *local_2e0;
  string local_2d8;
  undefined1 *local_2b8;
  undefined8 local_2b0;
  undefined1 local_2a8 [8];
  undefined8 uStack_2a0;
  undefined1 *local_298;
  size_type local_290;
  undefined1 local_288 [8];
  undefined8 uStack_280;
  undefined8 local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_270;
  undefined8 uStack_268;
  code *local_260;
  code *pcStack_258;
  string local_250;
  undefined1 *local_230;
  undefined8 local_228;
  undefined1 local_220 [8];
  undefined8 uStack_218;
  undefined1 *local_210;
  size_type local_208;
  undefined1 local_200 [8];
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1e8;
  undefined8 uStack_1e0;
  code *local_1d8;
  code *pcStack_1d0;
  string local_1c8;
  undefined1 *local_1a8;
  undefined8 local_1a0;
  undefined1 local_198 [8];
  undefined8 uStack_190;
  undefined1 *local_188;
  size_type local_180;
  undefined1 local_178 [8];
  undefined8 uStack_170;
  undefined4 local_168;
  undefined8 uStack_164;
  undefined4 uStack_15c;
  undefined4 local_158;
  undefined4 uStack_154;
  code *pcStack_150;
  code *local_148;
  string local_140;
  cmake **local_120;
  undefined8 local_118;
  cmake *local_110;
  undefined8 uStack_108;
  anon_class_1_0_00000001 *local_100;
  size_type local_f8;
  anon_class_1_0_00000001 local_f0 [8];
  undefined8 uStack_e8;
  undefined4 local_e0;
  undefined8 uStack_dc;
  undefined4 uStack_d4;
  undefined4 local_d0;
  undefined4 uStack_cc;
  code *pcStack_c8;
  code *local_c0;
  cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*)> local_b8 [136];
  
  local_5e8 = &local_5d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"-D","");
  local_508 = &local_4f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_508,"-D must be followed with VAR=VALUE.","");
  local_4c8._M_len = 0x17;
  local_4c8._M_str = " is invalid syntax for ";
  local_4b8 = local_5e0;
  local_4b0 = (anon_class_1_0_00000001 *)local_5e8;
  views._M_len = 2;
  views._M_array = &local_4c8;
  cmCatViews_abi_cxx11_(&local_470.InvalidSyntaxMessage,views);
  local_470.InvalidValueMessage._M_dataplus._M_p = (pointer)&local_470.InvalidValueMessage.field_2;
  if (local_508 == &local_4f8) {
    local_470.InvalidValueMessage.field_2._8_8_ = local_4f8._8_8_;
  }
  else {
    local_470.InvalidValueMessage._M_dataplus._M_p = (pointer)local_508;
  }
  local_470.Name._M_dataplus._M_p = (pointer)&local_470.Name.field_2;
  local_470.InvalidValueMessage._M_string_length = local_500;
  local_500 = 0;
  local_4f8._M_local_buf[0] = '\0';
  if (local_5e8 == &local_5d8) {
    local_470.Name.field_2._8_8_ = local_5d8._8_8_;
  }
  else {
    local_470.Name._M_dataplus._M_p = (pointer)local_5e8;
  }
  local_470.Name._M_string_length = local_5e0;
  local_5e0 = 0;
  local_5d8._M_local_buf[0] = '\0';
  local_470.Type = One;
  local_470.SeparatorNeeded = No;
  local_470.StoreCall.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_470.StoreCall.super__Function_base._M_functor._8_8_ = 0;
  local_470.StoreCall._M_invoker =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:417:23)>
       ::_M_invoke;
  local_470.StoreCall.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:417:23)>
       ::_M_manager;
  local_608 = &local_5f8;
  local_5e8 = &local_5d8;
  local_508 = &local_4f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"-W","");
  local_528 = &local_518;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_528,"-W must be followed with [no-]<name>.","");
  local_4c8._M_len = 0x17;
  local_4c8._M_str = " is invalid syntax for ";
  local_4b8 = local_600;
  local_4b0 = (anon_class_1_0_00000001 *)local_608;
  views_00._M_len = 2;
  views_00._M_array = &local_4c8;
  cmCatViews_abi_cxx11_(&local_3e8,views_00);
  local_3c8 = local_3b8;
  if (local_528 == &local_518) {
    uStack_3b0 = uStack_510;
  }
  else {
    local_3c8 = local_528;
  }
  local_3a8 = local_398;
  local_3c0 = local_520;
  local_520 = 0;
  local_518 = 0;
  if (local_608 == &local_5f8) {
    uStack_390 = uStack_5f0;
  }
  else {
    local_3a8 = local_608;
  }
  local_3a0 = local_600;
  local_600 = 0;
  local_5f8 = 0;
  local_388 = 0x100000001;
  local_380 = 0;
  uStack_378 = 0;
  local_368 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:434:24)>
              ::_M_invoke;
  local_370 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:434:24)>
              ::_M_manager;
  local_628 = &local_618;
  local_608 = &local_5f8;
  local_528 = &local_518;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"-U","");
  local_548 = &local_538;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_548,"-U must be followed with VAR.","");
  local_4c8._M_len = 0x17;
  local_4c8._M_str = " is invalid syntax for ";
  local_4b8 = local_620;
  local_4b0 = (anon_class_1_0_00000001 *)local_628;
  views_01._M_len = 2;
  views_01._M_array = &local_4c8;
  cmCatViews_abi_cxx11_(&local_360,views_01);
  local_340 = local_330;
  if (local_548 == &local_538) {
    uStack_328 = uStack_530;
  }
  else {
    local_340 = local_548;
  }
  local_320 = local_310;
  local_338 = local_540;
  local_540 = 0;
  local_538 = 0;
  if (local_628 == &local_618) {
    uStack_308 = uStack_610;
  }
  else {
    local_320 = local_628;
  }
  local_318 = local_620;
  local_620 = 0;
  local_618 = 0;
  local_300 = 0x100000001;
  local_2f8 = 0;
  uStack_2f0 = 0;
  local_2e0 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:475:22)>
              ::_M_invoke;
  local_2e8 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:475:22)>
              ::_M_manager;
  local_648 = &local_638;
  local_628 = &local_618;
  local_548 = &local_538;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,"-C","");
  local_568 = &local_558;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_568,"-C must be followed by a file name.","");
  local_4c8._M_len = 0x17;
  local_4c8._M_str = " is invalid syntax for ";
  local_4b8 = local_640;
  local_4b0 = (anon_class_1_0_00000001 *)local_648;
  views_02._M_len = 2;
  views_02._M_array = &local_4c8;
  cmCatViews_abi_cxx11_(&local_2d8,views_02);
  local_2b8 = local_2a8;
  if (local_568 == &local_558) {
    uStack_2a0 = uStack_550;
  }
  else {
    local_2b8 = local_568;
  }
  local_298 = local_288;
  local_2b0 = local_560;
  local_560 = 0;
  local_558 = 0;
  if (local_648 == &local_638) {
    uStack_280 = uStack_630;
  }
  else {
    local_298 = local_648;
  }
  local_290 = local_640;
  local_640 = 0;
  local_638 = 0;
  local_278 = 0x100000001;
  uStack_268 = 0;
  pcStack_258 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:552:7)>
                ::_M_invoke;
  local_260 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:552:7)>
              ::_M_manager;
  local_668 = &local_658;
  local_648 = &local_638;
  local_568 = &local_558;
  local_270 = args;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_668,"-P","");
  local_588 = &local_578;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_588,"-P must be followed by a file name.","");
  local_4c8._M_len = 0x17;
  local_4c8._M_str = " is invalid syntax for ";
  local_4b8 = local_660;
  local_4b0 = (anon_class_1_0_00000001 *)local_668;
  views_03._M_len = 2;
  views_03._M_array = &local_4c8;
  cmCatViews_abi_cxx11_(&local_250,views_03);
  local_230 = local_220;
  if (local_588 == &local_578) {
    uStack_218 = uStack_570;
  }
  else {
    local_230 = local_588;
  }
  local_210 = local_200;
  local_228 = local_580;
  local_580 = 0;
  local_578 = 0;
  if (local_668 == &local_658) {
    uStack_1f8 = uStack_650;
  }
  else {
    local_210 = local_668;
  }
  local_208 = local_660;
  local_660 = 0;
  local_658 = 0;
  local_1f0 = 0x100000001;
  uStack_1e0 = 0;
  pcStack_1d0 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:502:23)>
                ::_M_invoke;
  local_1d8 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:502:23)>
              ::_M_manager;
  local_688 = &local_678;
  local_668 = &local_658;
  local_588 = &local_578;
  local_1e8 = args;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_688,"--toolchain","");
  local_5a8 = &local_598;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5a8,"No file specified for --toolchain","");
  local_4c8._M_len = 0x17;
  local_4c8._M_str = " is invalid syntax for ";
  local_4b8 = local_680;
  local_4b0 = (anon_class_1_0_00000001 *)local_688;
  views_04._M_len = 2;
  views_04._M_array = &local_4c8;
  cmCatViews_abi_cxx11_(&local_1c8,views_04);
  local_1a8 = local_198;
  if (local_5a8 == &local_598) {
    uStack_190 = uStack_590;
  }
  else {
    local_1a8 = local_5a8;
  }
  local_188 = local_178;
  local_1a0 = local_5a0;
  local_5a0 = 0;
  local_598 = 0;
  if (local_688 == &local_678) {
    uStack_170 = uStack_670;
  }
  else {
    local_188 = local_688;
  }
  local_180 = local_680;
  local_680 = 0;
  local_678 = 0;
  local_168 = 1;
  uStack_154 = 0;
  uStack_164 = 0;
  uStack_15c = 0;
  local_158 = 0;
  local_148 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:529:26)>
              ::_M_invoke;
  pcStack_150 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:529:26)>
                ::_M_manager;
  local_688 = &local_678;
  local_5c8 = &local_5b8;
  local_5a8 = &local_598;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"--install-prefix","");
  local_4e8[0] = local_4d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4e8,"No install directory specified for --install-prefix","");
  local_4c8._M_len = 0x17;
  local_4c8._M_str = " is invalid syntax for ";
  local_4b8 = local_5c0;
  local_4b0 = local_5c8;
  views_05._M_len = 2;
  views_05._M_array = &local_4c8;
  cmCatViews_abi_cxx11_(&local_140,views_05);
  local_120 = &local_110;
  if (local_4e8[0] == local_4d8) {
    uStack_108 = local_4d8[1];
  }
  else {
    local_120 = local_4e8[0];
  }
  local_100 = local_f0;
  local_118 = local_4e8[1];
  local_4e8[1] = (cmake **)0x0;
  local_4d8[0]._0_1_ = 0;
  if (local_5c8 == &local_5b8) {
    uStack_e8 = uStack_5b0;
  }
  else {
    local_100 = local_5c8;
  }
  local_f8 = local_5c0;
  local_5c0 = 0;
  local_5b8 = (anon_class_1_0_00000001)0x0;
  local_e0 = 1;
  uStack_cc = 0;
  uStack_dc = 0;
  uStack_d4 = 0;
  local_d0 = 0;
  local_c0 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:514:23)>
             ::_M_invoke;
  pcStack_c8 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmake.cxx:514:23)>
               ::_M_manager;
  func = local_5c8;
  local_5c8 = &local_5b8;
  local_4e8[0] = local_4d8;
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"--find-package","");
  cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*)>::
  cmCommandLineArgument<(anonymous_namespace)::__8&>(local_b8,&local_4a8,t,func);
  __l._M_len = 8;
  __l._M_array = &local_470;
  std::
  vector<cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>,_std::allocator<cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>_>_>
  ::vector(&local_488,__l,(allocator_type *)&local_4c8);
  lVar10 = 0x440;
  do {
    pcVar1 = *(code **)((long)&local_488.
                               super__Vector_base<cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>,_std::allocator<cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + lVar10);
    if (pcVar1 != (code *)0x0) {
      lVar8 = (long)&local_4a8.field_2 + lVar10 + 8;
      (*pcVar1)(lVar8,lVar8,3);
    }
    plVar6 = (long *)((long)&local_4a8._M_dataplus._M_p + lVar10);
    if (plVar6 != *(long **)((long)&local_4b8 + lVar10)) {
      operator_delete(*(long **)((long)&local_4b8 + lVar10),*plVar6 + 1);
    }
    plVar6 = (long *)((long)&local_4c8._M_len + lVar10);
    if (plVar6 != *(long **)((long)local_4d8 + lVar10)) {
      operator_delete(*(long **)((long)local_4d8 + lVar10),*plVar6 + 1);
    }
    if ((long *)((long)local_4e8 + lVar10) != *(long **)(local_4f8._M_local_buf + lVar10)) {
      operator_delete(*(long **)(local_4f8._M_local_buf + lVar10),
                      *(long *)((long)local_4e8 + lVar10) + 1);
    }
    lVar10 = lVar10 + -0x88;
  } while (lVar10 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if (local_4e8[0] != local_4d8) {
    operator_delete(local_4e8[0],CONCAT71(local_4d8[0]._1_7_,local_4d8[0]._0_1_) + 1);
  }
  if (local_5c8 != &local_5b8) {
    operator_delete(local_5c8,CONCAT71(uStack_5b7,local_5b8) + 1);
  }
  if (local_5a8 != &local_598) {
    operator_delete(local_5a8,CONCAT71(uStack_597,local_598) + 1);
  }
  if (local_688 != &local_678) {
    operator_delete(local_688,CONCAT71(uStack_677,local_678) + 1);
  }
  if (local_588 != &local_578) {
    operator_delete(local_588,CONCAT71(uStack_577,local_578) + 1);
  }
  if (local_668 != &local_658) {
    operator_delete(local_668,CONCAT71(uStack_657,local_658) + 1);
  }
  if (local_568 != &local_558) {
    operator_delete(local_568,CONCAT71(uStack_557,local_558) + 1);
  }
  if (local_648 != &local_638) {
    operator_delete(local_648,CONCAT71(uStack_637,local_638) + 1);
  }
  if (local_548 != &local_538) {
    operator_delete(local_548,CONCAT71(uStack_537,local_538) + 1);
  }
  if (local_628 != &local_618) {
    operator_delete(local_628,CONCAT71(uStack_617,local_618) + 1);
  }
  if (local_528 != &local_518) {
    operator_delete(local_528,CONCAT71(uStack_517,local_518) + 1);
  }
  if (local_608 != &local_5f8) {
    operator_delete(local_608,CONCAT71(uStack_5f7,local_5f8) + 1);
  }
  if (local_508 != &local_4f8) {
    operator_delete(local_508,
                    CONCAT71(local_4f8._M_allocated_capacity._1_7_,local_4f8._M_local_buf[0]) + 1);
  }
  if (local_5e8 != &local_5d8) {
    operator_delete(local_5e8,
                    CONCAT71(local_5d8._M_allocated_capacity._1_7_,local_5d8._M_local_buf[0]) + 1);
  }
  local_470.InvalidSyntaxMessage._M_dataplus._M_p = &DAT_00000001;
  pbVar7 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0x20 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7)) {
    do {
      input = pbVar7 + (long)local_470.InvalidSyntaxMessage._M_dataplus._M_p;
      iVar5 = std::__cxx11::string::compare((char *)input);
      pcVar2 = local_488.
               super__Vector_base<cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>,_std::allocator<cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      iVar9 = 0;
      if ((iVar5 == 0) && (this->CurrentWorkingMode == SCRIPT_MODE)) {
        iVar9 = 2;
LAB_002071d4:
        bVar4 = false;
      }
      else {
        bVar4 = true;
        for (this_00 = local_488.
                       super__Vector_base<cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>,_std::allocator<cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; this_00 != pcVar2;
            this_00 = this_00 + 1) {
          bVar3 = cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                  ::matches(this_00,input);
          if (bVar3) {
            local_4c8._M_len = (size_t)this;
            bVar3 = cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*)>::
                    parse<unsigned_long,cmake*>
                              ((cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*)> *)
                               this_00,input,(unsigned_long *)&local_470,args,(cmake **)&local_4c8);
            if (!bVar3) {
              iVar9 = 1;
              goto LAB_002071d4;
            }
          }
        }
      }
      if (!bVar4) goto LAB_00207275;
      local_470.InvalidSyntaxMessage._M_dataplus._M_p =
           local_470.InvalidSyntaxMessage._M_dataplus._M_p + 1;
      pbVar7 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (local_470.InvalidSyntaxMessage._M_dataplus._M_p <
             (pointer)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5));
    iVar9 = 2;
LAB_00207275:
    if (iVar9 != 2) {
      bVar4 = false;
      goto LAB_0020729b;
    }
  }
  bVar4 = true;
  if (this->CurrentWorkingMode == FIND_PACKAGE_MODE) {
    bVar4 = FindPackage(this,args);
  }
LAB_0020729b:
  std::
  vector<cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>,_std::allocator<cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>_>_>
  ::~vector(&local_488);
  return bVar4;
}

Assistant:

bool cmake::SetCacheArgs(const std::vector<std::string>& args)
{
  auto DefineLambda = [](std::string const& entry, cmake* state) -> bool {
    std::string var;
    std::string value;
    cmStateEnums::CacheEntryType type = cmStateEnums::UNINITIALIZED;
    if (cmState::ParseCacheEntry(entry, var, value, type)) {
#ifndef CMAKE_BOOTSTRAP
      state->UnprocessedPresetVariables.erase(var);
#endif
      state->ProcessCacheArg(var, value, type);
    } else {
      cmSystemTools::Error(cmStrCat("Parse error in command line argument: ",
                                    entry, "\n Should be: VAR:type=value\n"));
      return false;
    }
    return true;
  };

  auto WarningLambda = [](cm::string_view entry, cmake* state) -> bool {
    bool foundNo = false;
    bool foundError = false;

    if (cmHasLiteralPrefix(entry, "no-")) {
      foundNo = true;
      entry.remove_prefix(3);
    }

    if (cmHasLiteralPrefix(entry, "error=")) {
      foundError = true;
      entry.remove_prefix(6);
    }

    if (entry.empty()) {
      cmSystemTools::Error("No warning name provided.");
      return false;
    }

    std::string const name = std::string(entry);
    if (!foundNo && !foundError) {
      // -W<name>
      state->DiagLevels[name] = std::max(state->DiagLevels[name], DIAG_WARN);
    } else if (foundNo && !foundError) {
      // -Wno<name>
      state->DiagLevels[name] = DIAG_IGNORE;
    } else if (!foundNo && foundError) {
      // -Werror=<name>
      state->DiagLevels[name] = DIAG_ERROR;
    } else {
      // -Wno-error=<name>
      // This can downgrade an error to a warning, but should not enable
      // or disable a warning in the first place.
      auto dli = state->DiagLevels.find(name);
      if (dli != state->DiagLevels.end()) {
        dli->second = std::min(dli->second, DIAG_WARN);
      }
    }
    return true;
  };

  auto UnSetLambda = [](std::string const& entryPattern,
                        cmake* state) -> bool {
    cmsys::RegularExpression regex(
      cmsys::Glob::PatternToRegex(entryPattern, true, true));
    // go through all cache entries and collect the vars which will be
    // removed
    std::vector<std::string> entriesToDelete;
    std::vector<std::string> cacheKeys = state->State->GetCacheEntryKeys();
    for (std::string const& ck : cacheKeys) {
      cmStateEnums::CacheEntryType t = state->State->GetCacheEntryType(ck);
      if (t != cmStateEnums::STATIC) {
        if (regex.find(ck)) {
          entriesToDelete.push_back(ck);
        }
      }
    }

    // now remove them from the cache
    for (std::string const& currentEntry : entriesToDelete) {
#ifndef CMAKE_BOOTSTRAP
      state->UnprocessedPresetVariables.erase(currentEntry);
#endif
      state->State->RemoveCacheEntry(currentEntry);
    }
    return true;
  };

  auto ScriptLambda = [&](std::string const& path, cmake* state) -> bool {
    // Register fake project commands that hint misuse in script mode.
    GetProjectCommandsInScriptMode(state->GetState());
    // Documented behavior of CMAKE{,_CURRENT}_{SOURCE,BINARY}_DIR is to be
    // set to $PWD for -P mode.
    state->SetWorkingMode(SCRIPT_MODE);
    state->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    state->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    state->ReadListFile(args, path);
    return true;
  };

  auto PrefixLambda = [&](std::string const& path, cmake* state) -> bool {
    const std::string var = "CMAKE_INSTALL_PREFIX";
    cmStateEnums::CacheEntryType type = cmStateEnums::PATH;
    cmCMakePath absolutePath(path);
    if (absolutePath.IsAbsolute()) {
#ifndef CMAKE_BOOTSTRAP
      state->UnprocessedPresetVariables.erase(var);
#endif
      state->ProcessCacheArg(var, path, type);
      return true;
    }
    cmSystemTools::Error("Absolute paths are required for --install-prefix");
    return false;
  };

  auto ToolchainLambda = [&](std::string const& path, cmake* state) -> bool {
    const std::string var = "CMAKE_TOOLCHAIN_FILE";
    cmStateEnums::CacheEntryType type = cmStateEnums::FILEPATH;
#ifndef CMAKE_BOOTSTRAP
    state->UnprocessedPresetVariables.erase(var);
#endif
    state->ProcessCacheArg(var, path, type);
    return true;
  };

  std::vector<CommandArgument> arguments = {
    CommandArgument{ "-D", "-D must be followed with VAR=VALUE.",
                     CommandArgument::Values::One,
                     CommandArgument::RequiresSeparator::No, DefineLambda },
    CommandArgument{ "-W", "-W must be followed with [no-]<name>.",
                     CommandArgument::Values::One,
                     CommandArgument::RequiresSeparator::No, WarningLambda },
    CommandArgument{ "-U", "-U must be followed with VAR.",
                     CommandArgument::Values::One,
                     CommandArgument::RequiresSeparator::No, UnSetLambda },
    CommandArgument{
      "-C", "-C must be followed by a file name.",
      CommandArgument::Values::One, CommandArgument::RequiresSeparator::No,
      [&](std::string const& value, cmake* state) -> bool {
        if (value.empty()) {
          cmSystemTools::Error("No file name specified for -C");
          return false;
        }
        cmSystemTools::Stdout("loading initial cache file " + value + "\n");
        // Resolve script path specified on command line
        // relative to $PWD.
        auto path = cmSystemTools::CollapseFullPath(value);
        state->ReadListFile(args, path);
        return true;
      } },

    CommandArgument{ "-P", "-P must be followed by a file name.",
                     CommandArgument::Values::One,
                     CommandArgument::RequiresSeparator::No, ScriptLambda },
    CommandArgument{ "--toolchain", "No file specified for --toolchain",
                     CommandArgument::Values::One, ToolchainLambda },
    CommandArgument{ "--install-prefix",
                     "No install directory specified for --install-prefix",
                     CommandArgument::Values::One, PrefixLambda },
    CommandArgument{ "--find-package", CommandArgument::Values::Zero,
                     IgnoreAndTrueLambda },
  };
  for (decltype(args.size()) i = 1; i < args.size(); ++i) {
    std::string const& arg = args[i];

    if (arg == "--" && this->GetWorkingMode() == SCRIPT_MODE) {
      // Stop processing CMake args and avoid possible errors
      // when arbitrary args are given to CMake script.
      break;
    }
    for (auto const& m : arguments) {
      if (m.matches(arg)) {
        const bool parsedCorrectly = m.parse(arg, i, args, this);
        if (!parsedCorrectly) {
          return false;
        }
      }
    }
  }

  if (this->GetWorkingMode() == FIND_PACKAGE_MODE) {
    return this->FindPackage(args);
  }

  return true;
}